

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

void __thiscall WScriptJsrt::ModuleMessage::~ModuleMessage(ModuleMessage *this)

{
  string *psVar1;
  pointer pcVar2;
  
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__ModuleMessage_001873a0;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(this->moduleRecord,(uint *)0x0);
  if (this->specifier != (JsValueRef)0x0) {
    psVar1 = this->fullPath;
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(this->specifier,(uint *)0x0);
  }
  return;
}

Assistant:

WScriptJsrt::ModuleMessage::~ModuleMessage()
{
    ChakraRTInterface::JsRelease(moduleRecord, nullptr);
    if (specifier != nullptr)
    {
        delete fullPath;
        ChakraRTInterface::JsRelease(specifier, nullptr);
    }
}